

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

void __thiscall Company::gift(Company *this)

{
  long *__nptr;
  int iVar1;
  string *psVar2;
  int *piVar3;
  long lVar4;
  Employee *pEVar5;
  undefined8 uVar6;
  long lVar7;
  long *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = Boss::getNumberOfEmployees(this->boss);
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      psVar2 = Person::getId_abi_cxx11_(&this->employeeArray[lVar7]->super_Person);
      std::__cxx11::string::substr((ulong)local_50,(ulong)psVar2);
      __nptr = local_50[0];
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      *piVar3 = 0;
      lVar4 = strtol((char *)__nptr,(char **)&local_58,10);
      if (local_58 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_00107a4f:
        uVar6 = std::__throw_out_of_range("stoi");
        if (*piVar3 == 0) {
          *piVar3 = iVar1;
        }
        gift();
        _Unwind_Resume(uVar6);
      }
      if (((int)lVar4 != lVar4) || (*piVar3 == 0x22)) goto LAB_00107a4f;
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((int)lVar4 < 0x5a) {
        pEVar5 = this->employeeArray[lVar7];
        iVar1 = Employee::getHourWork(pEVar5);
        Employee::setHourWork(pEVar5,iVar1 + 5);
      }
      lVar7 = lVar7 + 1;
      iVar1 = Boss::getNumberOfEmployees(this->boss);
    } while (lVar7 < iVar1);
  }
  pEVar5 = maxEfficiency(this);
  iVar1 = Employee::getHourWork(pEVar5);
  Employee::setHourWork(pEVar5,iVar1 + 10);
  return;
}

Assistant:

void Company::gift() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        if (stoi(employeeArray[i]->getId().substr(0, 2)) < 90)
            employeeArray[i]->setHourWork(employeeArray[i]->getHourWork() + 5);
    }
    Employee* em=maxEfficiency();//em= employeeArray max
     em->setHourWork(em->getHourWork()+10);
}